

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_tests.cc
# Opt level: O3

void __thiscall PointTest_Initialization_Test::TestBody(PointTest_Initialization_Test *this)

{
  char *pcVar1;
  double dVar2;
  point_t p3;
  point_t p2;
  point_t p1;
  AssertHelper AStack_58;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_50;
  internal local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  point_t local_38;
  point_t local_28;
  point_t local_18;
  
  point_init(&local_18,3.0,0.0);
  point_init(&local_28,0.0,4.0);
  point_new(&local_38);
  dVar2 = point_x(&local_18);
  testing::internal::CmpHelperFloatingPointEQ<float>(local_48,"point_x(&p1)","3.0",(float)dVar2,3.0)
  ;
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/gkthiruvathukal[P]systems-code-examples/simple_adt/point_tests.cc"
               ,0xf,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
  }
  else {
    if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_40,local_40);
    }
    dVar2 = point_y(&local_18);
    testing::internal::CmpHelperFloatingPointEQ<float>
              (local_48,"point_y(&p1)","0.0",(float)dVar2,0.0);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_50);
      if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = (local_40->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&AStack_58,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/gkthiruvathukal[P]systems-code-examples/simple_adt/point_tests.cc"
                 ,0x10,pcVar1);
      testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
    }
    else {
      if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_40,local_40);
      }
      dVar2 = point_x(&local_28);
      testing::internal::CmpHelperFloatingPointEQ<float>
                (local_48,"point_x(&p2)","0.0",(float)dVar2,0.0);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_50);
        if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = (local_40->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&AStack_58,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/gkthiruvathukal[P]systems-code-examples/simple_adt/point_tests.cc"
                   ,0x12,pcVar1);
        testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
      }
      else {
        if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_40,local_40);
        }
        dVar2 = point_y(&local_28);
        testing::internal::CmpHelperFloatingPointEQ<float>
                  (local_48,"point_y(&p2)","4.0",(float)dVar2,4.0);
        if (local_48[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_50);
          if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar1 = "";
          }
          else {
            pcVar1 = (local_40->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&AStack_58,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/gkthiruvathukal[P]systems-code-examples/simple_adt/point_tests.cc"
                     ,0x13,pcVar1);
          testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
        }
        else {
          if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_40,local_40);
          }
          dVar2 = point_x(&local_38);
          testing::internal::CmpHelperFloatingPointEQ<float>
                    (local_48,"point_x(&p3)","0.0",(float)dVar2,0.0);
          if (local_48[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_50);
            if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              pcVar1 = "";
            }
            else {
              pcVar1 = (local_40->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&AStack_58,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/gkthiruvathukal[P]systems-code-examples/simple_adt/point_tests.cc"
                       ,0x15,pcVar1);
            testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
          }
          else {
            if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_40,local_40);
            }
            dVar2 = point_y(&local_38);
            testing::internal::CmpHelperFloatingPointEQ<float>
                      (local_48,"point_y(&p3)","0.0",(float)dVar2,0.0);
            if (local_48[0] != (internal)0x0) goto LAB_00109998;
            testing::Message::Message((Message *)&local_50);
            if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              pcVar1 = "";
            }
            else {
              pcVar1 = (local_40->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&AStack_58,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/gkthiruvathukal[P]systems-code-examples/simple_adt/point_tests.cc"
                       ,0x16,pcVar1);
            testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
          }
        }
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&AStack_58);
  if (local_50._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_50._M_head_impl + 8))();
  }
LAB_00109998:
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  return;
}

Assistant:

TEST(PointTest, Initialization)
{
    point_t p1, p2, p3;

    point_init(&p1, 3, 0);
    point_init(&p2, 0, 4);
    point_new(&p3);

    ASSERT_FLOAT_EQ( point_x(&p1), 3.0);
    ASSERT_FLOAT_EQ( point_y(&p1), 0.0);

    ASSERT_FLOAT_EQ( point_x(&p2), 0.0);
    ASSERT_FLOAT_EQ( point_y(&p2), 4.0);

    ASSERT_FLOAT_EQ( point_x(&p3), 0.0);
    ASSERT_FLOAT_EQ( point_y(&p3), 0.0);

}